

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

uint32_t arm_fi_to_lfsc(ARMMMUFaultInfo_conflict1 *fi)

{
  ARMFaultType AVar1;
  
  AVar1 = fi->type;
  switch(AVar1) {
  case ARMFault_None:
    goto switchD_0061baca_caseD_0;
  case ARMFault_AccessFlag:
    AVar1 = fi->level & ARMFault_Background | ARMFault_SyncExternal;
    break;
  case ARMFault_Alignment:
    AVar1 = 0x21;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,0x2e8,(char *)0x0);
  case ARMFault_Permission:
    AVar1 = fi->level & ARMFault_Background | ARMFault_AsyncParity;
    break;
  case ARMFault_Translation:
    AVar1 = fi->level & ARMFault_Background | ARMFault_Domain;
    break;
  case ARMFault_AddressSize:
    AVar1 = fi->level & ARMFault_Background;
    break;
  case ARMFault_SyncExternal:
    AVar1 = (uint)fi->ea << 0xc | ARMFault_Lockdown;
    break;
  case ARMFault_SyncExternalOnWalk:
    AVar1 = (fi->level & 3U) + (uint)fi->ea * 0x1000 + ARMFault_QEMU_SFault;
    break;
  case ARMFault_SyncParity:
    AVar1 = ARMFault_Lockdown|ARMFault_SyncExternal;
    break;
  case ARMFault_SyncParityOnWalk:
    AVar1 = fi->level & ARMFault_Background | (ARMFault_Lockdown|ARMFault_AsyncParity);
    break;
  case ARMFault_AsyncParity:
    AVar1 = ARMFault_Lockdown|ARMFault_SyncExternalOnWalk;
    break;
  case ARMFault_AsyncExternal:
    AVar1 = (uint)fi->ea << 0xc | ARMFault_Exclusive;
    break;
  case ARMFault_Debug:
    AVar1 = 0x22;
    break;
  case ARMFault_TLBConflict:
    AVar1 = 0x30;
    break;
  case ARMFault_Lockdown:
    AVar1 = 0x34;
    break;
  case ARMFault_Exclusive:
    AVar1 = 0x35;
  }
  AVar1 = AVar1 | 0x200;
switchD_0061baca_caseD_0:
  return AVar1;
}

Assistant:

static inline uint32_t arm_fi_to_lfsc(ARMMMUFaultInfo *fi)
{
    uint32_t fsc = 0;

    switch (fi->type) {
    case ARMFault_None:
        return 0;
    case ARMFault_AddressSize:
        fsc = fi->level & 3;
        break;
    case ARMFault_AccessFlag:
        fsc = (fi->level & 3) | (0x2 << 2);
        break;
    case ARMFault_Permission:
        fsc = (fi->level & 3) | (0x3 << 2);
        break;
    case ARMFault_Translation:
        fsc = (fi->level & 3) | (0x1 << 2);
        break;
    case ARMFault_SyncExternal:
        fsc = 0x10 | (fi->ea << 12);
        break;
    case ARMFault_SyncExternalOnWalk:
        fsc = (fi->level & 3) | (0x5 << 2) | (fi->ea << 12);
        break;
    case ARMFault_SyncParity:
        fsc = 0x18;
        break;
    case ARMFault_SyncParityOnWalk:
        fsc = (fi->level & 3) | (0x7 << 2);
        break;
    case ARMFault_AsyncParity:
        fsc = 0x19;
        break;
    case ARMFault_AsyncExternal:
        fsc = 0x11 | (fi->ea << 12);
        break;
    case ARMFault_Alignment:
        fsc = 0x21;
        break;
    case ARMFault_Debug:
        fsc = 0x22;
        break;
    case ARMFault_TLBConflict:
        fsc = 0x30;
        break;
    case ARMFault_Lockdown:
        fsc = 0x34;
        break;
    case ARMFault_Exclusive:
        fsc = 0x35;
        break;
    default:
        /* Other faults can't occur in a context that requires a
         * long-format status code.
         */
        g_assert_not_reached();
        break;
    }

    fsc |= 1 << 9;
    return fsc;
}